

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

int __thiscall xscript::parser::ast::operator_precedence(ast *this,token_t t)

{
  token_t t_local;
  ast *this_local;
  
  switch(t) {
  case TK_ADD:
  case TK_SUB:
    this_local._4_4_ = 4;
    break;
  case TK_MUL:
  case TK_DIV:
  case TK_MOD:
    this_local._4_4_ = 3;
    break;
  case TK_BITWISE_AND:
    this_local._4_4_ = 8;
    break;
  case TK_BITWISE_OR:
    this_local._4_4_ = 10;
    break;
  default:
    this_local._4_4_ = -1;
    break;
  case TK_BITWISE_XOR:
    this_local._4_4_ = 9;
    break;
  case TK_BITWISE_SHL:
  case TK_BITWISE_SHR:
    this_local._4_4_ = 5;
    break;
  case TK_ASSIGN:
  case TK_ASSIGN_ADD:
  case TK_ASSIGN_SUB:
  case TK_ASSIGN_MUL:
  case TK_ASSIGN_DIV:
  case TK_ASSIGN_MOD:
  case TK_ASSIGN_AND:
  case TK_ASSIGN_OR:
  case TK_ASSIGN_XOR:
  case TK_ASSIGN_SHL:
  case TK_ASSIGN_SHR:
    this_local._4_4_ = 0xe;
    break;
  case TK_LOGIC_AND:
    this_local._4_4_ = 0xb;
    break;
  case TK_LOGIC_OR:
    this_local._4_4_ = 0xc;
    break;
  case TK_EQUAL:
  case TK_NOT_EQUAL:
    this_local._4_4_ = 7;
    break;
  case TK_GREATER:
  case TK_LESS:
  case TK_GREATER_EQUAL:
  case TK_LESS_EQUAL:
    this_local._4_4_ = 6;
    break;
  case TK_LEFT_PAREN:
  case TK_LEFT_BRACK:
    this_local._4_4_ = 0;
    break;
  case TK_DOT:
  case TK_RIGHT_ARROW:
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int ast::operator_precedence(tokenizer::token_t t) {
    switch (t) {
        case tokenizer::TK_LEFT_PAREN: // ()
        case tokenizer::TK_LEFT_BRACK: // []
            return 0;
        case tokenizer::TK_DOT:
        case tokenizer::TK_RIGHT_ARROW:
            return 1;
        // case 单目运算符:
        //     return 2;
        case tokenizer::TK_MUL:
        case tokenizer::TK_DIV:
        case tokenizer::TK_MOD:
            return 3;
        case tokenizer::TK_ADD:
        case tokenizer::TK_SUB:
            return 4;
        case tokenizer::TK_BITWISE_SHL:
        case tokenizer::TK_BITWISE_SHR:
            return 5;
        case tokenizer::TK_GREATER:
        case tokenizer::TK_LESS:
        case tokenizer::TK_GREATER_EQUAL:
        case tokenizer::TK_LESS_EQUAL:
            return 6;
        case tokenizer::TK_EQUAL:
        case tokenizer::TK_NOT_EQUAL:
            return 7;
        case tokenizer::TK_BITWISE_AND:
            return 8;
        case tokenizer::TK_BITWISE_XOR:
            return 9;
        case tokenizer::TK_BITWISE_OR:
            return 10;
        case tokenizer::TK_LOGIC_AND:
            return 11;
        case tokenizer::TK_LOGIC_OR:
            return 12;
        //case '?':
        //    return 13;
        case tokenizer::TK_ASSIGN:
        case tokenizer::TK_ASSIGN_ADD:
        case tokenizer::TK_ASSIGN_SUB:
        case tokenizer::TK_ASSIGN_MUL:
        case tokenizer::TK_ASSIGN_DIV:
        case tokenizer::TK_ASSIGN_MOD:
        case tokenizer::TK_ASSIGN_AND:
        case tokenizer::TK_ASSIGN_OR:
        case tokenizer::TK_ASSIGN_XOR:
        case tokenizer::TK_ASSIGN_SHL:
        case tokenizer::TK_ASSIGN_SHR:
            return 14;
        default:
            return -1;
    }
}